

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVIntHelpers.h
# Opt level: O0

void slang::lshrNear(uint64_t *dst,uint64_t *src,uint32_t words,uint32_t amount)

{
  ulong uVar1;
  uint64_t temp;
  ulong uStack_28;
  int i;
  uint64_t carry;
  uint32_t amount_local;
  uint32_t words_local;
  uint64_t *src_local;
  uint64_t *dst_local;
  
  uStack_28 = 0;
  for (temp._4_4_ = words - 1; -1 < temp._4_4_; temp._4_4_ = temp._4_4_ + -1) {
    uVar1 = src[temp._4_4_];
    dst[temp._4_4_] = uVar1 >> ((byte)amount & 0x3f) | uStack_28;
    uStack_28 = uVar1 << (0x40 - (byte)amount & 0x3f);
  }
  return;
}

Assistant:

static void lshrNear(uint64_t* dst, uint64_t* src, uint32_t words, uint32_t amount) {
    // fast case for logical right shift of a small amount (less than 64 bits)
    uint64_t carry = 0;
    for (int i = int(words - 1); i >= 0; i--) {
        uint64_t temp = src[i];
        dst[i] = (temp >> amount) | carry;
        carry = temp << (64 - amount);
    }
}